

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O3

UBool __thiscall
icu_63::UnicodeString::padLeading(UnicodeString *this,int32_t targetLength,UChar padChar)

{
  short sVar1;
  ushort uVar2;
  UBool UVar3;
  ulong uVar4;
  UBool UVar5;
  char16_t *__src;
  uint uVar6;
  int iVar7;
  int32_t iVar8;
  
  sVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar8 = (this->fUnion).fFields.fLength;
  }
  else {
    iVar8 = (int)sVar1 >> 5;
  }
  uVar6 = targetLength - iVar8;
  UVar5 = '\0';
  if (uVar6 != 0 && iVar8 <= targetLength) {
    UVar3 = cloneArrayIfNeeded(this,targetLength,-1,'\x01',(int32_t **)0x0,'\0');
    UVar5 = '\0';
    if (UVar3 != '\0') {
      if ((undefined1  [56])((undefined1  [56])this->fUnion & (undefined1  [56])0x2) ==
          (undefined1  [56])0x0) {
        __src = (this->fUnion).fFields.fArray;
      }
      else {
        __src = (char16_t *)((long)&this->fUnion + 2);
      }
      if (0 < iVar8) {
        memmove(__src + (int)uVar6,__src,(ulong)(uint)(iVar8 * 2));
      }
      if (0 < (int)uVar6) {
        uVar4 = (ulong)uVar6;
        iVar7 = uVar6 + 1;
        do {
          uVar4 = uVar4 - 1;
          __src[uVar4 & 0xffffffff] = padChar;
          iVar7 = iVar7 + -1;
        } while (1 < iVar7);
      }
      uVar2 = (this->fUnion).fStackFields.fLengthAndFlags;
      if (targetLength < 0x400) {
        (this->fUnion).fStackFields.fLengthAndFlags = (ushort)(targetLength << 5) | uVar2 & 0x1f;
      }
      else {
        (this->fUnion).fStackFields.fLengthAndFlags = uVar2 | 0xffe0;
        (this->fUnion).fFields.fLength = targetLength;
      }
      UVar5 = '\x01';
    }
  }
  return UVar5;
}

Assistant:

UBool 
UnicodeString::padLeading(int32_t targetLength,
                          UChar padChar)
{
  int32_t oldLength = length();
  if(oldLength >= targetLength || !cloneArrayIfNeeded(targetLength)) {
    return FALSE;
  } else {
    // move contents up by padding width
    UChar *array = getArrayStart();
    int32_t start = targetLength - oldLength;
    us_arrayCopy(array, 0, array, start, oldLength);

    // fill in padding character
    while(--start >= 0) {
      array[start] = padChar;
    }
    setLength(targetLength);
    return TRUE;
  }
}